

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O2

void __thiscall Transporter::Send(Transporter *this,int cmd,json *document)

{
  string documentText;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&documentText,document,-1,' ',false,ignore);
  (*this->_vptr_Transporter[3])
            (this,cmd,documentText._M_dataplus._M_p,documentText._M_string_length);
  std::__cxx11::string::~string((string *)&documentText);
  return;
}

Assistant:

void Transporter::Send(int cmd, const nlohmann::json document)
{
	std::string documentText = document.dump(-1, ' ', false, nlohmann::detail::error_handler_t::ignore);
	Send(cmd, documentText.data(), documentText.size());
}